

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# B3DImporter.cpp
# Opt level: O2

float __thiscall Assimp::B3DImporter::ReadFloat(B3DImporter *this)

{
  float fVar1;
  pointer puVar2;
  uint uVar3;
  B3DImporter *this_00;
  allocator<char> local_29;
  
  uVar3 = this->_pos + 4;
  puVar2 = (this->_buf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)uVar3 <=
      (ulong)((long)(this->_buf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar2)) {
    fVar1 = *(float *)(puVar2 + this->_pos);
    this->_pos = uVar3;
    return fVar1;
  }
  this_00 = (B3DImporter *)&stack0xffffffffffffffd8;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xffffffffffffffd8,"EOF",&local_29);
  Fail(this_00,(string *)&stack0xffffffffffffffd8);
}

Assistant:

float B3DImporter::ReadFloat(){
    if( _pos+4<=_buf.size() ){
        float n;
        memcpy(&n, &_buf[_pos], 4);
        _pos+=4;
        return n;
    }
    Fail( "EOF" );
    return 0.0f;
}